

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_SETP(Context *ctx)

{
  int iVar1;
  char *local_128;
  char *comp;
  char code [128];
  char src1 [64];
  char src0 [64];
  int vecsize;
  Context *ctx_local;
  
  iVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_METAL_srcarg_string_masked(ctx,0,src1 + 0x38,0x40);
  make_METAL_srcarg_string_masked(ctx,1,code + 0x78,0x40);
  if (iVar1 == 1) {
    local_128 = get_METAL_comparison_string_scalar(ctx);
  }
  else {
    local_128 = get_METAL_comparison_string_vector(ctx);
  }
  make_METAL_destarg_assign(ctx,(char *)&comp,0x80,"(%s %s %s)",src1 + 0x38,local_128,code + 0x78);
  output_line(ctx,"%s",&comp);
  return;
}

Assistant:

static void emit_METAL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    const char *comp = (vecsize == 1) ?
            get_METAL_comparison_string_scalar(ctx) :
            get_METAL_comparison_string_vector(ctx);

    make_METAL_destarg_assign(ctx, code, sizeof (code),
                              "(%s %s %s)", src0, comp, src1);
    output_line(ctx, "%s", code);
}